

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O3

size_t ecAddMulA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t k,...)

{
  long lVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  long *plVar6;
  uint local_d8;
  long local_b8 [7];
  va_list marker;
  
  lVar1 = k * 0x30 + n * ec_d * 8;
  if (k != 0) {
    local_d8 = 0x20;
    plVar5 = (long *)&stack0x00000008;
    do {
      if (local_d8 < 0x29) {
        uVar4 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        plVar3 = (long *)((long)local_b8 + uVar4);
        plVar6 = plVar5;
      }
      else {
        plVar6 = plVar5 + 1;
        plVar3 = plVar5;
      }
      uVar4 = *plVar3 << 6;
      bVar2 = 4;
      if ((uVar4 < 0x150) && (bVar2 = 3, uVar4 < 0x78)) {
        bVar2 = 2 - (uVar4 == 0);
      }
      lVar1 = lVar1 + *plVar3 * 0x10 + (n * ec_d << (bVar2 & 0x3f)) * 8 + 8;
      k = k - 1;
      plVar5 = plVar6;
    } while (k != 0);
  }
  return lVar1 + ec_deep;
}

Assistant:

size_t ecAddMulA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t k, ...)
{
	size_t i, ret;
	va_list marker;
	ret = O_OF_W(ec_d * n);
	ret += 4 * sizeof(size_t) * k;
	ret += 2 * sizeof(word**) * k;
	va_start(marker, k);
	for (i = 0; i < k; ++i)
	{
		size_t m = va_arg(marker, size_t);
		size_t naf_width = ecNAFWidth(B_OF_W(m));
		size_t naf_count = SIZE_1 << (naf_width - 2);
		ret += O_OF_W(2 * m + 1);
		ret += O_OF_W(ec_d * n * naf_count);
	}
	va_end(marker);
	ret += ec_deep;
	return ret;
}